

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O0

void __thiscall
google::
sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
::move_from(sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
            *this,MoveDontCopyT mover,
           sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
           *ht,size_type min_buckets_wanted)

{
  bool bVar1;
  size_type i;
  size_type sVar2;
  sparsetable<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  size_type sVar3;
  sparsetable<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_RCX;
  int in_ESI;
  sparsetable<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_RDI;
  size_type bucknum;
  size_type num_probes;
  destructive_iterator it;
  size_type resize_to;
  iterator *in_stack_ffffffffffffff08;
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff10;
  ulong in_stack_ffffffffffffff18;
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *local_c8;
  size_type in_stack_ffffffffffffff40;
  long lVar4;
  size_type in_stack_ffffffffffffff48;
  sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> *in_stack_ffffffffffffff50;
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffffa0;
  
  clear(in_stack_ffffffffffffff10);
  if (in_ESI == 1) {
    i = bucket_count((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)0xa6ca9f);
    local_c8 = in_stack_ffffffffffffff10;
  }
  else {
    size(in_stack_ffffffffffffff10);
    i = sparsehash_internal::sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>::
        min_buckets(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    local_c8 = in_stack_ffffffffffffff10;
  }
  sVar3 = i;
  sVar2 = bucket_count((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                        *)0xa6caea);
  if (sVar2 < i) {
    sparsetable<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::resize(in_RCX,sVar3);
    bucket_count((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)0xa6cb17);
    sparsehash_internal::sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>::
    reset_thresholds((sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> *)local_c8,
                     (size_type)in_stack_ffffffffffffff08);
  }
  destructive_begin(in_stack_ffffffffffffffa0);
  while( true ) {
    destructive_end(in_stack_ffffffffffffffa0);
    bVar1 = sparse_hashtable_destructive_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
            ::operator!=((sparse_hashtable_destructive_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                          *)local_c8,in_stack_ffffffffffffff08);
    if (!bVar1) break;
    lVar4 = 0;
    sparse_hashtable_destructive_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_destructive_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                 *)0xa6cb7c);
    get_key(local_c8,(const_reference)in_stack_ffffffffffffff08);
    this_00 = (sparsetable<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)sparse_hashtable<char_const*,char_const*,Hasher,google::sparse_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                 ::hash<char_const*>(local_c8,(char **)in_stack_ffffffffffffff08);
    sVar3 = bucket_count((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                          *)0xa6cba5);
    local_c8 = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)((ulong)this_00 & sVar3 - 1);
    while( true ) {
      bVar1 = sparsetable<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::test(this_00,in_stack_ffffffffffffff18);
      if (!bVar1) break;
      lVar4 = lVar4 + 1;
      in_stack_ffffffffffffff18 =
           (long)&(local_c8->settings).
                  super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher.
                  id_ + lVar4;
      sVar3 = bucket_count((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)0xa6cbf9);
      local_c8 = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)(in_stack_ffffffffffffff18 & sVar3 - 1);
    }
    in_stack_ffffffffffffff08 =
         (iterator *)
         &in_RDI[1].groups.
          super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
          ._M_impl.super__Tp_alloc_type.count_;
    sparse_hashtable_destructive_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_destructive_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                 *)0xa6cc33);
    sparsetable<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::set(in_RDI,i,(const_reference)this_00);
    sparse_hashtable_destructive_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::operator++((sparse_hashtable_destructive_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)local_c8);
  }
  sparsehash_internal::sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>::
  inc_num_ht_copies((sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> *)in_RDI);
  return;
}

Assistant:

void move_from(MoveDontCopyT mover, sparse_hashtable& ht,
                 size_type min_buckets_wanted) {
    clear();  // clear table, set num_deleted to 0

    // If we need to change the size of our table, do it now
    size_type resize_to;
    if (mover == MoveDontGrow)
      resize_to = ht.bucket_count();  // keep same size as old ht
    else                              // MoveDontCopy
      resize_to = settings.min_buckets(ht.size(), min_buckets_wanted);
    if (resize_to > bucket_count()) {  // we don't have enough buckets
      table.resize(resize_to);         // sets the number of buckets
      settings.reset_thresholds(bucket_count());
    }

    // We use a normal iterator to get non-deleted bcks from ht
    // We could use insert() here, but since we know there are
    // no duplicates and no deleted items, we can be more efficient
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // a power of two
    // THIS IS THE MAJOR LINE THAT DIFFERS FROM COPY_FROM():
    for (destructive_iterator it = ht.destructive_begin();
         it != ht.destructive_end(); ++it) {
      size_type num_probes = 0;  // how many times we've probed
      size_type bucknum;
      for (bucknum = hash(get_key(*it)) & (bucket_count() - 1);  // h % buck_cnt
           table.test(bucknum);                                  // not empty
           bucknum =
               (bucknum + JUMP_(key, num_probes)) & (bucket_count() - 1)) {
        ++num_probes;
        assert(num_probes < bucket_count() &&
               "Hashtable is full: an error in key_equal<> or hash<>");
      }
      table.set(bucknum, *it);  // copies the value to here
    }
    settings.inc_num_ht_copies();
  }